

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O2

string * __thiscall
cfd::core::AbstractTransaction::GetHex_abi_cxx11_
          (string *__return_storage_ptr__,AbstractTransaction *this)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  (*this->_vptr_AbstractTransaction[8])(&_Stack_28);
  ByteData::GetHex_abi_cxx11_(__return_storage_ptr__,(ByteData *)&_Stack_28);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return __return_storage_ptr__;
}

Assistant:

std::string AbstractTransaction::GetHex() const { return GetData().GetHex(); }